

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O1

Var Js::JavascriptNumber::EntryToExponential(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptString *pJVar7;
  RecyclableObject *pRVar8;
  CallInfo scriptContext_00;
  uint formatDigits;
  Type TVar9;
  double dVar10;
  int in_stack_00000010;
  Type local_78;
  Type TStack_70;
  Type local_68;
  double value;
  Var result;
  CallInfo callInfo_local;
  undefined1 auStack_48 [8];
  ArgumentReader args;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  result = (Var)callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (in_stack_00000010 != (int)result) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x227,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) goto LAB_00cea7aa;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  auStack_48 = (undefined1  [8])result;
  ArgumentReader::AdjustArguments((ArgumentReader *)auStack_48,(CallInfo *)&result);
  scriptContext_00 =
       (CallInfo)
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  if (((ulong)result & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x22a,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) goto LAB_00cea7aa;
    *puVar5 = 0;
  }
  if (((ulong)auStack_48 & 0xffffff) == 0) {
LAB_00cea796:
    JavascriptError::ThrowTypeError
              ((ScriptContext *)scriptContext_00,-0x7ff5ec3c,L"Number.prototype.toExponential");
  }
  pvVar6 = Arguments::operator[]((Arguments *)auStack_48,0);
  BVar3 = GetThisValue(pvVar6,(double *)&local_68);
  if (BVar3 == 0) {
    pvVar6 = Arguments::operator[]((Arguments *)auStack_48,0);
    if (pvVar6 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00cea7aa;
      *puVar5 = 0;
    }
    if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) goto LAB_00cea7aa;
      *puVar5 = 0;
    }
    TVar9 = TypeIds_FirstNumberType;
    if ((((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) &&
       (TVar9 = TypeIds_Number, (ulong)pvVar6 >> 0x32 == 0)) {
      pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar6);
      if (pRVar8 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) goto LAB_00cea7aa;
        *puVar5 = 0;
      }
      TVar9 = ((pRVar8->type).ptr)->typeId;
      if ((0x57 < (int)TVar9) && (BVar3 = RecyclableObject::IsExternal(pRVar8), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) goto LAB_00cea7aa;
        *puVar5 = 0;
      }
    }
    if (TVar9 == TypeIds_HostDispatch) {
      pvVar6 = Arguments::operator[]((Arguments *)auStack_48,0);
      pRVar8 = VarTo<Js::RecyclableObject>(pvVar6);
      local_78 = (Type)auStack_48;
      TStack_70 = args.super_Arguments.Info;
      iVar4 = (*(pRVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x55])(pRVar8,EntryToExponential,&local_78,&value);
      if (iVar4 != 0) {
        return (Var)value;
      }
    }
    goto LAB_00cea796;
  }
  args.super_Arguments.Values = local_68;
  pJVar7 = ToStringNanOrInfinite((double)local_68,(ScriptContext *)scriptContext_00);
  if (pJVar7 != (JavascriptString *)0x0) {
    return pJVar7;
  }
  if (((ulong)auStack_48 & 0xfffffe) == 0) {
    formatDigits = 0xffffffff;
    goto LAB_00cea777;
  }
  callInfo_local = scriptContext_00;
  pvVar6 = Arguments::operator[]((Arguments *)auStack_48,1);
  if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00cea7aa;
    *puVar5 = 0;
  }
  scriptContext_00 = callInfo_local;
  if (((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) {
    if (((ulong)pvVar6 & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar2) {
LAB_00cea7aa:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    bVar2 = true;
  }
  else {
    if (pvVar6 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00cea7aa;
      *puVar5 = 0;
    }
    if ((ulong)pvVar6 >> 0x32 == 0) {
      pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar6);
      if (pRVar8 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) goto LAB_00cea7aa;
        *puVar5 = 0;
      }
      TVar9 = ((pRVar8->type).ptr)->typeId;
      if (0x57 < (int)TVar9) {
        BVar3 = RecyclableObject::IsExternal(pRVar8);
        if (BVar3 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) goto LAB_00cea7aa;
          *puVar5 = 0;
        }
        goto LAB_00cea743;
      }
    }
    else {
LAB_00cea743:
      TVar9 = TypeIds_Number;
    }
    if (TVar9 == TypeIds_Undefined) {
      pvVar6 = (Var)0xffffffff;
    }
    else {
      dVar10 = JavascriptConversion::ToInteger_Full(pvVar6,(ScriptContext *)scriptContext_00);
      pvVar6 = (Var)(ulong)(uint)(int)dVar10;
    }
    bVar2 = TVar9 != TypeIds_Undefined;
  }
  formatDigits = (uint)pvVar6;
  if ((bVar2) && (0x14 < formatDigits)) {
    JavascriptError::ThrowRangeError((ScriptContext *)scriptContext_00,-0x7ff5ec5e,(PCWSTR)0x0);
  }
LAB_00cea777:
  pvVar6 = FormatDoubleToString
                     ((double)args.super_Arguments.Values,FormatExponential,formatDigits,
                      (ScriptContext *)scriptContext_00);
  return pvVar6;
}

Assistant:

Var JavascriptNumber::EntryToExponential(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toExponential"));
        }

        AssertMsg(args.Info.Count > 0, "negative arg count");

        // spec implies ToExp is not generic. 'this' must be a number
        double value;
        if (!GetThisValue(args[0], &value))
        {
            if (JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch)
            {
                Var result;
                if (VarTo<RecyclableObject>(args[0])->InvokeBuiltInOperationRemotely(EntryToExponential, args, &result))
                {
                    return result;
                }
            }

            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toExponential"));
        }

        JavascriptString * nanF;
        if (nullptr != (nanF = ToStringNanOrInfinite(value, scriptContext)))
            return nanF;

        // If the Fraction param. is not present we have to output as many fractional digits as we can
        int fractionDigits = -1;

        if(args.Info.Count > 1)
        {
            //use the first arg as the fraction digits, ignore the rest.
            Var aFractionDigits = args[1];
            bool noRangeCheck = false;

            // shortcut for tagged int's
            if(TaggedInt::Is(aFractionDigits))
            {
                fractionDigits = TaggedInt::ToInt32(aFractionDigits);
            }
            else if(JavascriptOperators::GetTypeId(aFractionDigits) == TypeIds_Undefined)
            {
                // fraction undefined -> digits = -1, output as many fractional digits as we can
                noRangeCheck = true;
            }
            else
            {
                fractionDigits = (int)JavascriptConversion::ToInteger(aFractionDigits, scriptContext);
            }
            if(!noRangeCheck && (fractionDigits < 0 || fractionDigits >20))
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_FractionOutOfRange);
            }
        }

        return FormatDoubleToString(value, Js::NumberUtilities::FormatExponential, fractionDigits, scriptContext);
    }